

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O2

uint32_t ogt_vox_sample_anim_model(ogt_vox_anim_model *anim,uint32_t frame_index)

{
  uint uVar1;
  ogt_vox_keyframe_model *poVar2;
  uint uVar3;
  
  if (anim->num_keyframes == 0) {
    __assert_fail("(anim->num_keyframes >= 1) && (\"need at least one keyframe to sample\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x518,"uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model *, uint32_t)")
    ;
  }
  if (anim->loop == true) {
    frame_index = compute_looped_frame_index
                            (anim->keyframes->frame_index,
                             anim->keyframes[anim->num_keyframes - 1].frame_index,frame_index);
  }
  poVar2 = anim->keyframes;
  if (poVar2->frame_index < frame_index) {
    uVar1 = anim->num_keyframes - 1;
    if (frame_index < poVar2[uVar1].frame_index) {
      uVar1 = anim->num_keyframes - 2;
      do {
        uVar3 = uVar1;
        if ((int)uVar3 < 0) {
          __assert_fail("(0) && (\"shouldn\'t reach here\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0x525,
                        "uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model *, uint32_t)");
        }
        uVar1 = uVar3 - 1;
      } while (frame_index < poVar2[uVar3].frame_index);
      poVar2 = poVar2 + uVar3;
    }
    else {
      poVar2 = poVar2 + uVar1;
    }
  }
  return poVar2->model_index;
}

Assistant:

uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model* anim, uint32_t frame_index)
    {
        ogt_assert(anim->num_keyframes >= 1, "need at least one keyframe to sample");
        if (anim->loop) {
            frame_index = compute_looped_frame_index(anim->keyframes[0].frame_index, anim->keyframes[anim->num_keyframes-1].frame_index, frame_index);
        }
        if (frame_index <= anim->keyframes[0].frame_index)
            return anim->keyframes[0].model_index;
        if (frame_index >=anim-> keyframes[anim->num_keyframes-1].frame_index)
            return anim->keyframes[anim->num_keyframes-1].model_index;
        for (int32_t f = (int32_t)anim->num_keyframes-2; f >= 0; f--) {
            if (frame_index >= anim->keyframes[f].frame_index) {
                return anim->keyframes[f+0].model_index;
            }
        }
        ogt_assert(0, "shouldn't reach here");
        return anim->keyframes[0].model_index;
    }